

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pTextureCases.cpp
# Opt level: O2

int __thiscall
deqp::gles2::Performance::Texture2DRenderCase::init(Texture2DRenderCase *this,EVP_PKEY_CTX *ctx)

{
  Mat3 *mtx;
  TestLog *pTVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar4;
  ostream *poVar5;
  Texture2D *this_00;
  long lVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  int texNdx;
  EVP_PKEY_CTX *ctx_00;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  long lVar14;
  uint local_250;
  uint local_24c;
  Texture2D *texture;
  Enum<int,_2UL> local_238;
  uint local_220;
  uint local_21c;
  undefined1 local_218 [32];
  Vec4 local_1f8;
  float local_1e8 [2];
  float afStack_1e0 [2];
  Vector<float,_2> local_1d8;
  Vector<float,_2> local_1d0;
  Vector<float,_2> local_1c8;
  vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_> *local_1c0;
  Vector<float,_2> local_1b8;
  ostringstream fragSrc;
  ostringstream local_1a8 [376];
  
  pTVar1 = ((this->super_ShaderPerformanceCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  iVar3 = (*((this->super_ShaderPerformanceCase).m_renderCtx)->_vptr_RenderContext[4])();
  local_24c = *(uint *)CONCAT44(extraout_var,iVar3);
  iVar3 = (*((this->super_ShaderPerformanceCase).m_renderCtx)->_vptr_RenderContext[4])();
  local_250 = *(uint *)(CONCAT44(extraout_var_00,iVar3) + 4);
  if (this->m_powerOfTwo == true) {
    iVar3 = 0x1f;
    if (local_24c != 0) {
      for (; local_24c >> iVar3 == 0; iVar3 = iVar3 + -1) {
      }
    }
    iVar2 = 0x1f;
    if (local_250 != 0) {
      for (; local_250 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    local_24c = local_24c & -(0x80000000U >> (~(byte)iVar3 & 0x1f));
    local_250 = local_250 & -(0x80000000U >> (~(byte)iVar2 & 0x1f));
  }
  uVar13 = this->m_minFilter;
  local_218._0_8_ = (GetNameFunc)0x0;
  mtx = &this->m_coordTransform;
  local_218._8_4_ = 1.0;
  tcu::operator*((tcu *)&fragSrc,mtx,(Vector<float,_3> *)local_218);
  local_1c8.m_data = (float  [2])_fragSrc;
  local_218._0_8_ = (GetNameFunc)0x3f800000;
  local_218._8_4_ = 1.0;
  tcu::operator*((tcu *)&fragSrc,mtx,(Vector<float,_3> *)local_218);
  local_1d0.m_data = (float  [2])_fragSrc;
  local_218._0_8_ = (GetNameFunc)0x3f80000000000000;
  local_218._8_4_ = 1.0;
  tcu::operator*((tcu *)&fragSrc,mtx,(Vector<float,_3> *)local_218);
  local_1d8.m_data = (float  [2])_fragSrc;
  local_218._0_8_ = (GetNameFunc)0x3f8000003f800000;
  local_218._8_4_ = 1.0;
  tcu::operator*((tcu *)&fragSrc,mtx,(Vector<float,_3> *)local_218);
  local_1b8.m_data = (float  [2])_fragSrc;
  local_218._0_4_ = local_1c8.m_data[0];
  local_218._4_4_ = local_1c8.m_data[1];
  local_218._8_8_ = 0;
  local_238.m_getName = (GetNameFunc)local_1d0.m_data;
  local_238.m_value = 0;
  local_238._12_4_ = 0;
  local_1e8[0] = local_1d8.m_data[0];
  local_1e8[1] = local_1d8.m_data[1];
  afStack_1e0[0] = 0.0;
  afStack_1e0[1] = 0.0;
  local_1f8.m_data._0_8_ = _fragSrc;
  local_1f8.m_data[2] = 0.0;
  local_1f8.m_data[3] = 0.0;
  deqp::gls::AttribSpec::AttribSpec
            ((AttribSpec *)&fragSrc,"a_coords",(Vec4 *)local_218,(Vec4 *)&local_238,
             (Vec4 *)local_1e8,&local_1f8);
  std::vector<deqp::gls::AttribSpec,_std::allocator<deqp::gls::AttribSpec>_>::
  emplace_back<deqp::gls::AttribSpec>
            (&(this->super_ShaderPerformanceCase).m_attributes,(AttribSpec *)&fragSrc);
  std::__cxx11::string::~string((string *)&fragSrc);
  _fragSrc = (pointer)pTVar1;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::operator<<((ostream *)local_1a8,"Size: ");
  std::ostream::operator<<(local_1a8,local_24c);
  std::operator<<((ostream *)local_1a8,"x");
  std::ostream::operator<<(local_1a8,local_250);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&fragSrc,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  _fragSrc = (pointer)pTVar1;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::operator<<((ostream *)local_1a8,"Format: ");
  pcVar4 = glu::getTextureFormatName(this->m_format);
  std::operator<<((ostream *)local_1a8,pcVar4);
  std::operator<<((ostream *)local_1a8," ");
  pcVar4 = glu::getTypeName(this->m_dataType);
  std::operator<<((ostream *)local_1a8,pcVar4);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&fragSrc,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  _fragSrc = (pointer)pTVar1;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::operator<<((ostream *)local_1a8,"Coords: ");
  tcu::operator<<((ostream *)local_1a8,&local_1c8);
  std::operator<<((ostream *)local_1a8,", ");
  tcu::operator<<((ostream *)local_1a8,&local_1d0);
  std::operator<<((ostream *)local_1a8,", ");
  tcu::operator<<((ostream *)local_1a8,&local_1d8);
  std::operator<<((ostream *)local_1a8,", ");
  tcu::operator<<((ostream *)local_1a8,&local_1b8);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&fragSrc,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  _fragSrc = (pointer)pTVar1;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::operator<<((ostream *)local_1a8,"Wrap: ");
  local_218._0_8_ = glu::getTextureWrapModeName;
  local_218._8_4_ = this->m_wrapS;
  tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)local_218,(ostream *)local_1a8);
  std::operator<<((ostream *)local_1a8," / ");
  local_238.m_getName = glu::getTextureWrapModeName;
  local_238.m_value = this->m_wrapT;
  tcu::Format::Enum<int,_2UL>::toStream(&local_238,(ostream *)local_1a8);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&fragSrc,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  _fragSrc = (pointer)pTVar1;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::operator<<((ostream *)local_1a8,"Filter: ");
  local_218._0_8_ = glu::getTextureFilterName;
  local_218._8_4_ = this->m_minFilter;
  tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)local_218,(ostream *)local_1a8);
  std::operator<<((ostream *)local_1a8," / ");
  local_238.m_getName = glu::getTextureFilterName;
  local_238.m_value = this->m_magFilter;
  tcu::Format::Enum<int,_2UL>::toStream(&local_238,(ostream *)local_1a8);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&fragSrc,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  _fragSrc = (pointer)pTVar1;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::operator<<((ostream *)local_1a8,"Mipmaps: ");
  local_220 = uVar13 & 0xfffffffc;
  pcVar4 = "false";
  if (local_220 == 0x2700) {
    pcVar4 = "true";
  }
  std::operator<<((ostream *)local_1a8,pcVar4);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&fragSrc,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  _fragSrc = (pointer)pTVar1;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::operator<<((ostream *)local_1a8,"Using additive blending.");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&fragSrc,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  deqp::gls::ShaderPerformanceCase::setViewportSize
            (&this->super_ShaderPerformanceCase,local_24c,local_250);
  std::__cxx11::string::assign((char *)&(this->super_ShaderPerformanceCase).m_vertShaderSource);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&fragSrc);
  std::operator<<((ostream *)&fragSrc,"varying mediump vec2 v_coords;\n");
  for (iVar3 = 0; iVar3 < this->m_numTextures; iVar3 = iVar3 + 1) {
    poVar5 = std::operator<<((ostream *)&fragSrc,"uniform sampler2D u_sampler");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3);
    std::operator<<(poVar5,";\n");
  }
  poVar5 = std::operator<<((ostream *)&fragSrc,"void main (void)\n");
  std::operator<<(poVar5,"{\n");
  for (iVar3 = 0; iVar3 < this->m_numTextures; iVar3 = iVar3 + 1) {
    poVar5 = std::operator<<((ostream *)&fragSrc,"\t");
    pcVar4 = "r += ";
    if (iVar3 == 0) {
      pcVar4 = "lowp vec4 r = ";
    }
    poVar5 = std::operator<<(poVar5,pcVar4);
    poVar5 = std::operator<<(poVar5,"texture2D(u_sampler");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3);
    std::operator<<(poVar5,", v_coords);\n");
  }
  poVar5 = std::operator<<((ostream *)&fragSrc,"\tgl_FragColor = r;\n");
  std::operator<<(poVar5,"}\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=
            ((string *)&(this->super_ShaderPerformanceCase).m_fragShaderSource,(string *)local_218);
  std::__cxx11::string::~string((string *)local_218);
  local_1c0 = &this->m_textures;
  ctx_00 = (EVP_PKEY_CTX *)(long)this->m_numTextures;
  std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::reserve
            (local_1c0,(size_type)ctx_00);
  uVar13 = 0;
  while ((int)uVar13 < this->m_numTextures) {
    if ((init()::swizzles == '\0') && (iVar3 = __cxa_guard_acquire(&init()::swizzles), iVar3 != 0))
    {
      init::swizzles[0].m_data[0] = _DAT_005de160;
      init::swizzles[0].m_data[1] = _UNK_005de164;
      init::swizzles[0].m_data[2] = _UNK_005de168;
      init::swizzles[0].m_data[3] = _UNK_005de16c;
      init::swizzles[1].m_data[0] = _DAT_005de170;
      init::swizzles[1].m_data[1] = _UNK_005de174;
      init::swizzles[1].m_data[2] = _UNK_005de178;
      init::swizzles[1].m_data[3] = _UNK_005de17c;
      init::swizzles[2].m_data[0] = _DAT_005de180;
      init::swizzles[2].m_data[1] = _UNK_005de184;
      init::swizzles[2].m_data[2] = _UNK_005de188;
      init::swizzles[2].m_data[3] = _UNK_005de18c;
      init::swizzles[3].m_data[0] = _DAT_005de190;
      init::swizzles[3].m_data[1] = _UNK_005de194;
      init::swizzles[3].m_data[2] = _UNK_005de198;
      init::swizzles[3].m_data[3] = _UNK_005de19c;
      init::swizzles[4].m_data[0] = _DAT_005de1a0;
      init::swizzles[4].m_data[1] = _UNK_005de1a4;
      init::swizzles[4].m_data[2] = _UNK_005de1a8;
      init::swizzles[4].m_data[3] = _UNK_005de1ac;
      init::swizzles[5].m_data[0] = _DAT_005de1b0;
      init::swizzles[5].m_data[1] = _UNK_005de1b4;
      init::swizzles[5].m_data[2] = _UNK_005de1b8;
      init::swizzles[5].m_data[3] = _UNK_005de1bc;
      init::swizzles[6].m_data[0] = _DAT_005de1c0;
      init::swizzles[6].m_data[1] = _UNK_005de1c4;
      init::swizzles[6].m_data[2] = _UNK_005de1c8;
      init::swizzles[6].m_data[3] = _UNK_005de1cc;
      init::swizzles[7].m_data[0] = _DAT_005de1d0;
      init::swizzles[7].m_data[1] = _UNK_005de1d4;
      init::swizzles[7].m_data[2] = _UNK_005de1d8;
      init::swizzles[7].m_data[3] = _UNK_005de1dc;
      __cxa_guard_release(&init()::swizzles);
    }
    this_00 = (Texture2D *)operator_new(0x70);
    glu::Texture2D::Texture2D
              (this_00,(this->super_ShaderPerformanceCase).m_renderCtx,this->m_format,
               this->m_dataType,local_24c,local_250);
    ctx_00 = (EVP_PKEY_CTX *)&texture;
    texture = this_00;
    std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::push_back
              (local_1c0,(value_type *)ctx_00);
    uVar12 = 1;
    if (local_220 == 0x2700) {
      uVar12 = (uint)(((long)(texture->m_refTexture).super_TextureLevelPyramid.m_access.
                             super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(texture->m_refTexture).super_TextureLevelPyramid.m_access.
                            super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x28);
    }
    uVar9 = (ulong)((uVar13 & 7) << 4);
    if ((int)uVar12 < 1) {
      uVar12 = 0;
    }
    lVar14 = 0;
    local_21c = uVar13;
    for (uVar11 = 0; uVar12 != uVar11; uVar11 = uVar11 + 1) {
      tcu::Texture2D::allocLevel(&texture->m_refTexture,(int)uVar11);
      local_238.m_getName = (GetNameFunc)0x0;
      local_238.m_value = 0;
      local_238._12_4_ = 0;
      lVar6 = (long)*(int *)((long)init::swizzles[0].m_data + uVar9);
      lVar7 = (long)*(int *)((long)init::swizzles[0].m_data + uVar9 + 4);
      lVar8 = (long)*(int *)((long)init::swizzles[0].m_data + uVar9 + 8);
      lVar10 = (long)*(int *)((long)init::swizzles[0].m_data + uVar9 + 0xc);
      local_218._4_4_ = *(undefined4 *)((long)&local_238.m_getName + lVar7 * 4);
      local_218._0_4_ = *(undefined4 *)((long)&local_238.m_getName + lVar6 * 4);
      local_218._12_4_ = *(float *)((long)&local_238.m_getName + lVar10 * 4);
      local_218._8_4_ = *(float *)((long)&local_238.m_getName + lVar8 * 4);
      local_1f8.m_data._0_8_ = (GetNameFunc)0x3f8000003f800000;
      local_1f8.m_data[2] = 1.0;
      local_1f8.m_data[3] = 1.0;
      local_1e8[1] = local_1f8.m_data[lVar7];
      local_1e8[0] = local_1f8.m_data[lVar6];
      afStack_1e0[1] = local_1f8.m_data[lVar10];
      afStack_1e0[0] = local_1f8.m_data[lVar8];
      ctx_00 = (EVP_PKEY_CTX *)local_218;
      tcu::fillWithComponentGradients
                ((PixelBufferAccess *)
                 ((long)(((texture->m_refTexture).super_TextureLevelPyramid.m_access.
                          super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_start)->super_ConstPixelBufferAccess).
                        m_size.m_data + lVar14 + -8),(Vec4 *)local_218,(Vec4 *)local_1e8);
      lVar14 = lVar14 + 0x28;
    }
    (*texture->_vptr_Texture2D[2])();
    uVar13 = local_21c + 1;
  }
  deqp::gls::ShaderPerformanceCase::init(&this->super_ShaderPerformanceCase,ctx_00);
  iVar3 = std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fragSrc);
  return iVar3;
}

Assistant:

void Texture2DRenderCase::init (void)
{
	TestLog& log = m_testCtx.getLog();

	int width	= m_renderCtx.getRenderTarget().getWidth();
	int height	= m_renderCtx.getRenderTarget().getHeight();

	if (m_powerOfTwo)
	{
		width	= roundDownToPowerOfTwo(width);
		height	= roundDownToPowerOfTwo(height);
	}

	bool mipmaps = m_minFilter == GL_NEAREST_MIPMAP_NEAREST ||
				   m_minFilter == GL_NEAREST_MIPMAP_LINEAR	||
				   m_minFilter == GL_LINEAR_MIPMAP_NEAREST	||
				   m_minFilter == GL_LINEAR_MIPMAP_LINEAR;

	DE_ASSERT(m_powerOfTwo || (!mipmaps && m_wrapS == GL_CLAMP_TO_EDGE && m_wrapT == GL_CLAMP_TO_EDGE));

	Vec2 p00 = (m_coordTransform * Vec3(0.0f, 0.0f, 1.0f)).swizzle(0,1);
	Vec2 p10 = (m_coordTransform * Vec3(1.0f, 0.0f, 1.0f)).swizzle(0,1);
	Vec2 p01 = (m_coordTransform * Vec3(0.0f, 1.0f, 1.0f)).swizzle(0,1);
	Vec2 p11 = (m_coordTransform * Vec3(1.0f, 1.0f, 1.0f)).swizzle(0,1);

	m_attributes.push_back(AttribSpec("a_coords", Vec4(p00.x(), p00.y(), 0.0f, 0.0f),
												  Vec4(p10.x(), p10.y(), 0.0f, 0.0f),
												  Vec4(p01.x(), p01.y(), 0.0f, 0.0f),
												  Vec4(p11.x(), p11.y(), 0.0f, 0.0f)));

	log << TestLog::Message << "Size: " << width << "x" << height << TestLog::EndMessage;
	log << TestLog::Message << "Format: " <<glu::getTextureFormatName(m_format) << " " << glu::getTypeName(m_dataType) << TestLog::EndMessage;
	log << TestLog::Message << "Coords: " << p00 << ", " << p10 << ", " << p01 << ", " << p11 << TestLog::EndMessage;
	log << TestLog::Message << "Wrap: " << glu::getTextureWrapModeStr(m_wrapS) << " / " << glu::getTextureWrapModeStr(m_wrapT) << TestLog::EndMessage;
	log << TestLog::Message << "Filter: " << glu::getTextureFilterStr(m_minFilter) << " / " << glu::getTextureFilterStr(m_magFilter) << TestLog::EndMessage;
	log << TestLog::Message << "Mipmaps: " << (mipmaps ? "true" : "false") << TestLog::EndMessage;
	log << TestLog::Message << "Using additive blending." << TestLog::EndMessage;

	// Use same viewport size as texture size.
	setViewportSize(width, height);

	m_vertShaderSource =
		"attribute highp vec4 a_position;\n"
		"attribute mediump vec2 a_coords;\n"
		"varying mediump vec2 v_coords;\n"
		"void main (void)\n"
		"{\n"
		"	gl_Position = a_position;\n"
		"	v_coords = a_coords;\n"
		"}\n";

	std::ostringstream fragSrc;
	fragSrc << "varying mediump vec2 v_coords;\n";

	for (int texNdx = 0; texNdx < m_numTextures; texNdx++)
		fragSrc << "uniform sampler2D u_sampler" << texNdx << ";\n";

	fragSrc << "void main (void)\n"
			<< "{\n";

	for (int texNdx = 0; texNdx < m_numTextures; texNdx++)
		fragSrc << "\t" << (texNdx == 0 ? "lowp vec4 r = " : "r += ") << "texture2D(u_sampler" << texNdx << ", v_coords);\n";

	fragSrc << "	gl_FragColor = r;\n"
			<< "}\n";

	m_fragShaderSource = fragSrc.str();

	m_textures.reserve(m_numTextures);
	for (int texNdx = 0; texNdx < m_numTextures; texNdx++)
	{
		static const IVec4 swizzles[] = { IVec4(0,1,2,3), IVec4(1,2,3,0), IVec4(2,3,0,1), IVec4(3,0,1,2),
										  IVec4(3,2,1,0), IVec4(2,1,0,3), IVec4(1,0,3,2), IVec4(0,3,2,1) };
		const IVec4& sw = swizzles[texNdx % DE_LENGTH_OF_ARRAY(swizzles)];

		glu::Texture2D* texture = new glu::Texture2D(m_renderCtx, m_format, m_dataType, width, height);
		m_textures.push_back(texture);

		// Fill levels.
		int numLevels = mipmaps ? texture->getRefTexture().getNumLevels() : 1;
		for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
		{
			texture->getRefTexture().allocLevel(levelNdx);
			tcu::fillWithComponentGradients(texture->getRefTexture().getLevel(levelNdx),
											Vec4(0.0f, 0.0f, 0.0f, 0.0f).swizzle(sw[0], sw[1], sw[2], sw[3]),
											Vec4(1.0f, 1.0f, 1.0f, 1.0f).swizzle(sw[0], sw[1], sw[2], sw[3]));
		}

		texture->upload();
	}

	ShaderPerformanceCase::init();
}